

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_vxc_helper_unpolar<ExchCXX::BuiltinR2SCANL_C>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double *vrho_00;
  double *vsigma_00;
  double *vtau_00;
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_98;
  long local_90;
  const_host_buffer_type local_88;
  const_host_buffer_type local_80;
  const_host_buffer_type local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (0 < N) {
    lVar1 = (ulong)(uint)N << 3;
    lVar2 = 0;
    local_90 = lVar1;
    local_88 = rho;
    local_80 = sigma;
    local_78 = lapl;
    do {
      local_70 = *(double *)((long)rho + lVar2);
      vrho_00 = (double *)((long)vrho + lVar2);
      vsigma_00 = (double *)((long)vsigma + lVar2);
      vtau_00 = (double *)((long)vtau + lVar2);
      if (local_70 <= 1e-15) {
        *(double *)((long)eps + lVar2) = 0.0;
        *vrho_00 = 0.0;
        *vsigma_00 = 0.0;
        *vtau_00 = 0.0;
        dVar3 = 0.0;
        dVar4 = 0.0;
        dVar5 = 0.0;
        dVar6 = 0.0;
      }
      else {
        local_60 = *(double *)((long)local_78 + lVar2);
        local_68 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= *(double *)((long)local_80 + lVar2)) {
          local_68 = *(double *)((long)local_80 + lVar2);
        }
        kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_vxc_unpolar_impl
                  (local_70,local_68,local_60,0.0,&local_98,&local_48,&local_50,&local_58,&local_38)
        ;
        local_98 = local_98 * local_70;
        dVar6 = 1e-20;
        if (1e-20 <= local_98) {
          dVar6 = local_98;
        }
        dVar3 = local_70 * 8.0 * dVar6;
        if (local_68 <= dVar3) {
          dVar3 = local_68;
        }
        kernel_traits<ExchCXX::BuiltinR2SCAN_C>::eval_exc_vxc_unpolar_impl
                  (local_70,dVar3,local_60,dVar6,(double *)((long)eps + lVar2),vrho_00,vsigma_00,
                   &local_40,vtau_00);
        dVar6 = *vtau_00;
        rho = local_88;
        lVar1 = local_90;
        dVar3 = local_58;
        dVar4 = local_50;
        dVar5 = local_48;
      }
      *vrho_00 = dVar5 * dVar6 + *vrho_00;
      *vsigma_00 = dVar4 * *vtau_00 + *vsigma_00;
      dVar6 = *vtau_00;
      *vtau_00 = 0.0;
      *(double *)((long)vlapl + lVar2) = dVar3 * dVar6;
      lVar2 = lVar2 + 8;
    } while (lVar1 != lVar2);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_GENERATOR( host_eval_exc_vxc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const auto lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    double vl;
    traits::eval_exc_vxc_unpolar( rho[i], sigma[i], lapl_i, tau[i],
      eps[i], vrho[i], vsigma[i], vl, vtau[i] );
    if(traits::needs_laplacian) vlapl[i] = vl;

  }

}